

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

Vec_Wec_t * Mop_ManCubeCount(Mop_Man_t *p)

{
  int iVar1;
  word *pwVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  iVar1 = p->nOuts;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar8;
  if (iVar8 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)iVar8,0x10);
  }
  pVVar6->pArray = pVVar7;
  pVVar6->nSize = iVar1;
  pVVar7 = p->vCubes;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      iVar1 = pVVar7->pArray[lVar9];
      if (iVar1 != -1) {
        uVar4 = p->nWordsOut * iVar1;
        if (((int)uVar4 < 0) || (p->vWordsOut->nSize <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (0 < p->nOuts) {
          pwVar2 = p->vWordsOut->pArray;
          lVar10 = 0;
          uVar11 = 0;
          do {
            if ((pwVar2[(ulong)uVar4 + (uVar11 >> 6 & 0x3ffffff)] >> (uVar11 & 0x3f) & 1) != 0) {
              if ((long)pVVar6->nSize <= (long)uVar11) {
                uVar3 = pVVar6->nSize * 2;
                uVar5 = (int)uVar11 + 1;
                if ((int)uVar3 <= (int)uVar5) {
                  uVar3 = uVar5;
                }
                iVar8 = pVVar6->nCap;
                if (iVar8 < (int)uVar3) {
                  if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                    pVVar7 = (Vec_Int_t *)malloc((ulong)uVar3 << 4);
                  }
                  else {
                    pVVar7 = (Vec_Int_t *)realloc(pVVar6->pArray,(ulong)uVar3 << 4);
                  }
                  pVVar6->pArray = pVVar7;
                  memset(pVVar7 + iVar8,0,(long)(int)(uVar3 - iVar8) << 4);
                  pVVar6->nCap = uVar3;
                }
                pVVar6->nSize = (int)uVar11 + 1;
              }
              if ((long)pVVar6->nSize <= (long)uVar11) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                              ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
              }
              Vec_IntPush((Vec_Int_t *)((long)&pVVar6->pArray->nCap + lVar10),iVar1);
            }
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x10;
          } while ((long)uVar11 < (long)p->nOuts);
        }
      }
      lVar9 = lVar9 + 1;
      pVVar7 = p->vCubes;
    } while (lVar9 < pVVar7->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Wec_t * Mop_ManCubeCount( Mop_Man_t * p )
{
    int i, k, iCube;
    Vec_Wec_t * vOuts = Vec_WecStart( p->nOuts );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
    if ( iCube != -1 )
    {
        word * pCube = Mop_ManCubeOut( p, iCube );
        for ( k = 0; k < p->nOuts; k++ )
            if ( Abc_TtGetBit( pCube, k ) )
                Vec_WecPush( vOuts, k, iCube );
    }
    return vOuts;
}